

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  ImRect IVar9;
  
  IVar1 = window->Pos;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = IVar1.x;
  auVar7._4_4_ = IVar1.y;
  fVar6 = IVar1.x;
  auVar4._0_4_ = fVar6 + (window->Size).x;
  auVar4._4_4_ = IVar1.y + (window->Size).y;
  auVar4._8_8_ = 0;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    auVar4._0_4_ = auVar4._0_4_ + -1.0;
    auVar4._4_4_ = auVar4._4_4_ + -1.0;
    auVar4._8_4_ = 0xbf800000;
    auVar4._12_4_ = 0xbf800000;
  }
  fVar3 = auVar4._0_4_;
  switch(border_n) {
  case 0:
    auVar4 = vmovshdup_avx(auVar7);
    fVar8 = auVar4._0_4_;
    break;
  case 1:
    auVar7 = vmovshdup_avx(auVar7);
    fVar5 = auVar7._0_4_;
    goto LAB_00166388;
  case 2:
    auVar4 = vmovshdup_avx(auVar4);
    fVar8 = auVar4._0_4_;
    break;
  case 3:
    auVar7 = vmovshdup_avx(auVar7);
    fVar5 = auVar7._0_4_;
    fVar3 = fVar6;
LAB_00166388:
    fVar2 = fVar3 + thickness;
    fVar5 = fVar5 + perp_padding;
    fVar6 = fVar3 - thickness;
    auVar4 = vmovshdup_avx(auVar4);
    fVar8 = auVar4._0_4_ - perp_padding;
    goto LAB_00166390;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1490,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  fVar6 = fVar6 + perp_padding;
  fVar5 = fVar8 - thickness;
  fVar2 = fVar3 - perp_padding;
  fVar8 = fVar8 + thickness;
LAB_00166390:
  auVar4 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar8),0x10);
  auVar7 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5),0x10);
  IVar9.Min = auVar7._0_8_;
  IVar9.Max = auVar4._0_8_;
  return IVar9;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1, 1);
    if (border_n == 0) { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    } // Top
    if (border_n == 1) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); } // Right
    if (border_n == 2) { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    } // Bottom
    if (border_n == 3) { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); } // Left
    IM_ASSERT(0);
    return ImRect();
}